

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Teleport.cpp
# Opt level: O1

int Teleport::GetFloatParameterCallback
              (UnityAudioEffectState *state,int index,float *value,char *valuestr)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  
  pfVar2 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar2 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,"T *UnityAudioEffectState::GetEffectData() const [T = Teleport::EffectData]"
                 );
  }
  if ((state->field_0).field_0.internal == (void *)0x0) {
    __assert_fail("internal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfe,"T *UnityAudioEffectState::GetEffectData() const [T = Teleport::EffectData]"
                 );
  }
  iVar1 = 1;
  if (index < 8) {
    if (value != (float *)0x0) {
      if (index < 4) {
        pfVar2 = pfVar2 + index;
      }
      else {
        uVar3 = (uint)*pfVar2;
        if ((int)uVar3 < 0) {
          __assert_fail("stream >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                        ,0x81,
                        "int Teleport::GetFloatParameterCallback(UnityAudioEffectState *, int, float *, char *)"
                       );
        }
        if (7 < (int)uVar3) {
          __assert_fail("stream < Teleport::NUMSTREAMS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                        ,0x82,
                        "int Teleport::GetFloatParameterCallback(UnityAudioEffectState *, int, float *, char *)"
                       );
        }
        if (GetSharedMemory()::shared == '\0') {
          iVar1 = __cxa_guard_acquire(&GetSharedMemory()::shared);
          if (iVar1 != 0) {
            SharedMemoryHandle::SharedMemoryHandle((SharedMemoryHandle *)&GetSharedMemory()::shared)
            ;
            __cxa_atexit(SharedMemoryHandle::~SharedMemoryHandle,&GetSharedMemory()::shared,
                         &__dso_handle);
            __cxa_guard_release(&GetSharedMemory()::shared);
          }
        }
        pfVar2 = (float *)((ulong)uVar3 * 0x56248 + GetSharedMemory()::shared +
                          (ulong)(index - 4) * 8);
      }
      *value = *pfVar2;
    }
    iVar1 = 0;
    if (valuestr != (char *)0x0) {
      *valuestr = '\0';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK GetFloatParameterCallback(UnityAudioEffectState* state, int index, float* value, char *valuestr)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;

        if (value != NULL)
        {
            if (index >= P_PARAM1 && index <= P_PARAM4)
            {
                int stream = (int)data->p[P_STREAM];
                assert(stream >= 0);
                assert(stream < Teleport::NUMSTREAMS);

                SharedMemoryHandle& shared = GetSharedMemory();
                Stream& s = shared->streams[stream];

                *value = s.params[index - P_PARAM1].value;
            }
            else
                *value = data->p[index];
        }

        if (valuestr != NULL)
            valuestr[0] = 0;

        return UNITY_AUDIODSP_OK;
    }